

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  int iVar7;
  size_t sVar8;
  byte *pbVar9;
  BYTE *pBVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  int iVar16;
  byte *pbVar17;
  U32 *pUVar18;
  uint *puVar19;
  uint uVar20;
  uint uVar21;
  ulong *puVar22;
  int iVar23;
  ulong *puVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong *puVar29;
  ulong *puVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  byte *pbVar35;
  ulong uVar36;
  BYTE *pBVar37;
  U32 UVar38;
  BYTE *pBVar39;
  uint uVar40;
  uint uVar41;
  uint *puVar42;
  U32 *pUVar43;
  bool bVar44;
  BYTE *pInLoopLimit;
  U32 dummy32_1;
  U32 dummy32;
  U32 *bt;
  ulong local_130;
  U32 *local_120;
  byte *local_118;
  byte *local_110;
  ulong local_108;
  U32 *local_e8;
  uint *local_e0;
  uint local_78;
  U32 local_74;
  U32 *local_70;
  ulong local_68;
  ulong local_60;
  U32 *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ulong *local_40;
  ulong *local_38;
  
  local_58 = ms->hashTable;
  local_68 = (ulong)(mls - 5);
  cVar15 = (char)(ms->cParams).hashLog;
  switch(local_68) {
  case 0:
    lVar32 = -0x30e4432345000000;
    break;
  case 1:
    lVar32 = -0x30e4432340650000;
    break;
  case 2:
    lVar32 = -0x30e44323405a9d00;
    break;
  case 3:
    local_60 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_0014a4b8;
  default:
    local_60 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar15 & 0x1fU));
    goto LAB_0014a4bd;
  }
  local_60 = lVar32 * *(long *)ip;
LAB_0014a4b8:
  local_60 = local_60 >> (-cVar15 & 0x3fU);
LAB_0014a4bd:
  pBVar4 = (ms->window).base;
  uVar25 = (int)ip - (int)pBVar4;
  uVar1 = (ms->window).lowLimit;
  uVar20 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar26 = uVar25 - uVar20;
  if (uVar25 < uVar20) {
    uVar26 = 0;
  }
  uVar31 = uVar1;
  if (uVar1 < uVar26) {
    uVar31 = uVar26;
  }
  uVar27 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  pUVar43 = ms->chainTable;
  uVar21 = local_58[local_60];
  uVar11 = 0;
  uVar40 = uVar27;
  if (uVar31 < uVar21) {
    uVar36 = 0;
    do {
      uVar11 = (ulong)uVar21;
      uVar14 = (ulong)((uVar21 & uVar20) * 2);
      if ((pUVar43[uVar14 + 1] != 1) || (uVar40 < 2)) {
        uVar11 = uVar36;
        if (pUVar43[uVar14 + 1] == 1) {
          (pUVar43 + uVar14)[0] = 0;
          (pUVar43 + uVar14)[1] = 0;
        }
        break;
      }
      pUVar43[uVar14 + 1] = (U32)uVar36;
      uVar40 = uVar40 - 1;
      uVar21 = pUVar43[uVar14];
      uVar36 = uVar11;
    } while (uVar31 < uVar21);
  }
  local_70 = pUVar43;
  if ((int)uVar11 != 0) {
    pBVar5 = (ms->window).dictBase;
    do {
      uVar33 = (uint)uVar11;
      uVar21 = pUVar43[(ulong)((uVar33 & uVar20) * 2) + 1];
      uVar28 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar2 = (ms->window).dictLimit;
      pbVar17 = (byte *)(ulong)uVar2;
      local_40 = (ulong *)(pBVar5 + (long)pbVar17);
      puVar24 = (ulong *)iend;
      pBVar37 = pBVar4;
      if (uVar33 < uVar2) {
        puVar24 = local_40;
        pBVar37 = pBVar5;
      }
      pBVar37 = pBVar37 + uVar11;
      local_50 = pBVar4 + (long)pbVar17;
      uVar3 = (uVar33 & uVar28) * 2;
      local_120 = pUVar43 + uVar3;
      local_e8 = pUVar43 + uVar3 + 1;
      UVar38 = pUVar43[uVar3];
      uVar3 = (ms->window).lowLimit;
      local_38 = (ulong *)((long)puVar24 + -1);
      local_110 = (byte *)0x0;
      local_118 = (byte *)0x0;
      uVar41 = uVar40;
      local_48 = pBVar37;
      do {
        bVar44 = uVar41 == 0;
        uVar41 = uVar41 - 1;
        if ((bVar44) || (UVar38 <= uVar3)) break;
        pbVar9 = local_110;
        if (local_118 < local_110) {
          pbVar9 = local_118;
        }
        pBVar10 = pBVar4;
        if (dictMode == ZSTD_extDict) {
          if ((uVar33 < uVar2) || (pbVar17 <= pbVar9 + UVar38)) {
            if (pbVar9 + UVar38 < pbVar17) {
              pBVar10 = pBVar5;
            }
            goto LAB_0014a74d;
          }
          sVar8 = ZSTD_count_2segments
                            (pBVar37 + (long)pbVar9,pBVar5 + UVar38 + (long)pbVar9,(BYTE *)puVar24,
                             (BYTE *)local_40,local_50);
          pbVar9 = pbVar9 + sVar8;
          pBVar10 = pBVar4 + UVar38;
          pBVar37 = local_48;
          pUVar43 = local_70;
          if (pbVar9 + UVar38 < pbVar17) {
            pBVar10 = pBVar5 + UVar38;
          }
        }
        else {
LAB_0014a74d:
          puVar22 = (ulong *)(pBVar37 + (long)pbVar9);
          puVar30 = (ulong *)(pBVar10 + UVar38 + (long)pbVar9);
          puVar29 = puVar22;
          if (puVar22 < (ulong *)((long)puVar24 - 7U)) {
            uVar36 = *puVar22 ^ *puVar30;
            uVar11 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            pbVar35 = (byte *)(uVar11 >> 3 & 0x1fffffff);
            if (*puVar30 == *puVar22) {
              do {
                puVar29 = puVar29 + 1;
                puVar30 = puVar30 + 1;
                if ((ulong *)((long)puVar24 - 7U) <= puVar29) goto LAB_0014a7c1;
                uVar36 = *puVar29 ^ *puVar30;
                uVar11 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                  }
                }
                pbVar35 = (byte *)((long)puVar29 + ((uVar11 >> 3 & 0x1fffffff) - (long)puVar22));
              } while (*puVar30 == *puVar29);
            }
          }
          else {
LAB_0014a7c1:
            if ((puVar29 < (ulong *)((long)puVar24 - 3U)) && ((int)*puVar30 == (int)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar30 = (ulong *)((long)puVar30 + 4);
            }
            if ((puVar29 < local_38) && ((short)*puVar30 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar30 = (ulong *)((long)puVar30 + 2);
            }
            if (puVar29 < puVar24) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((byte)*puVar30 == (byte)*puVar29));
            }
            pbVar35 = (byte *)((long)puVar29 - (long)puVar22);
          }
          pbVar9 = pbVar35 + (long)pbVar9;
          pBVar10 = pBVar10 + UVar38;
        }
        if ((ulong *)(pBVar37 + (long)pbVar9) == puVar24) {
          bVar44 = false;
        }
        else {
          pUVar18 = pUVar43 + (UVar38 & uVar28) * 2;
          if (pBVar10[(long)pbVar9] < (byte)*(ulong *)(pBVar37 + (long)pbVar9)) {
            *local_120 = UVar38;
            local_118 = pbVar9;
            if (uVar31 < UVar38) {
              pUVar18 = pUVar18 + 1;
              local_120 = pUVar18;
LAB_0014a868:
              UVar38 = *pUVar18;
              bVar44 = true;
            }
            else {
              bVar44 = false;
              local_120 = &local_74;
            }
          }
          else {
            *local_e8 = UVar38;
            local_110 = pbVar9;
            local_e8 = pUVar18;
            if (uVar31 < UVar38) goto LAB_0014a868;
            bVar44 = false;
            local_e8 = &local_74;
          }
        }
      } while (bVar44);
      *local_e8 = 0;
      *local_120 = 0;
      uVar40 = uVar40 + 1;
      uVar11 = (ulong)uVar21;
    } while (uVar21 != 0);
  }
  pBVar5 = (ms->window).dictBase;
  uVar36 = (ulong)(ms->window).dictLimit;
  uVar11 = (ulong)((uVar20 & uVar25) * 2);
  puVar42 = pUVar43 + uVar11;
  local_e0 = pUVar43 + uVar11 + 1;
  iVar23 = uVar25 + 9;
  uVar14 = (ulong)local_58[local_60];
  local_58[local_60] = uVar25;
  local_110 = (byte *)0x0;
  local_118 = (byte *)0x0;
  uVar11 = 0;
  do {
    bVar44 = uVar27 == 0;
    uVar27 = uVar27 - 1;
    if ((bVar44) || (uVar31 = (uint)uVar14, uVar31 <= uVar1)) break;
    pbVar17 = local_118;
    if (local_110 < local_118) {
      pbVar17 = local_110;
    }
    if ((dictMode == ZSTD_extDict) && ((long)pbVar17 + uVar14 < uVar36)) {
      pBVar10 = pBVar5 + uVar14;
      sVar8 = ZSTD_count_2segments
                        (ip + (long)pbVar17,pBVar10 + (long)pbVar17,iend,pBVar5 + uVar36,
                         pBVar4 + uVar36);
      uVar12 = sVar8 + (long)pbVar17;
      pBVar37 = pBVar4 + uVar14;
      if (uVar12 + uVar14 < uVar36) {
        pBVar37 = pBVar10;
      }
    }
    else {
      puVar24 = (ulong *)(ip + (long)pbVar17);
      puVar22 = (ulong *)(pBVar4 + uVar14 + (long)pbVar17);
      puVar30 = puVar24;
      if (puVar24 < iend + -7) {
        uVar13 = *puVar24 ^ *puVar22;
        uVar12 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar12 = uVar12 >> 3 & 0x1fffffff;
        if (*puVar22 == *puVar24) {
          do {
            puVar30 = puVar30 + 1;
            puVar22 = puVar22 + 1;
            if (iend + -7 <= puVar30) goto LAB_0014aa9b;
            uVar13 = *puVar30 ^ *puVar22;
            uVar12 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar12 = (long)puVar30 + ((uVar12 >> 3 & 0x1fffffff) - (long)puVar24);
          } while (*puVar22 == *puVar30);
        }
      }
      else {
LAB_0014aa9b:
        if ((puVar30 < iend + -3) && ((int)*puVar22 == (int)*puVar30)) {
          puVar30 = (ulong *)((long)puVar30 + 4);
          puVar22 = (ulong *)((long)puVar22 + 4);
        }
        if ((puVar30 < iend + -1) && ((short)*puVar22 == (short)*puVar30)) {
          puVar30 = (ulong *)((long)puVar30 + 2);
          puVar22 = (ulong *)((long)puVar22 + 2);
        }
        if (puVar30 < iend) {
          puVar30 = (ulong *)((long)puVar30 + (ulong)((char)*puVar22 == (char)*puVar30));
        }
        uVar12 = (long)puVar30 - (long)puVar24;
      }
      uVar12 = uVar12 + (long)pbVar17;
      pBVar37 = pBVar4 + uVar14;
    }
    if (uVar11 < uVar12) {
      iVar34 = (int)uVar12 + uVar31;
      if (uVar12 <= iVar23 - uVar31) {
        iVar34 = iVar23;
      }
      uVar21 = (uVar25 + 1) - uVar31;
      iVar23 = 0x1f;
      if (uVar21 != 0) {
        for (; uVar21 >> iVar23 == 0; iVar23 = iVar23 + -1) {
        }
      }
      uVar21 = (int)*offsetPtr + 1;
      iVar16 = 0x1f;
      if (uVar21 != 0) {
        for (; uVar21 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      if (iVar23 - iVar16 < ((int)uVar12 - (int)uVar11) * 4) {
        *offsetPtr = (ulong)((uVar25 + 2) - uVar31);
        uVar11 = uVar12;
      }
      iVar23 = iVar34;
      if (ip + uVar12 != iend) goto LAB_0014ab69;
      bVar44 = false;
      if (dictMode == ZSTD_dictMatchState) {
        uVar27 = 0;
      }
    }
    else {
LAB_0014ab69:
      puVar19 = local_70 + (uVar31 & uVar20) * 2;
      if (pBVar37[uVar12] < ip[uVar12]) {
        *puVar42 = uVar31;
        local_110 = (byte *)uVar12;
        if (uVar26 < uVar31) {
          puVar19 = puVar19 + 1;
          puVar42 = puVar19;
LAB_0014abc7:
          uVar14 = (ulong)*puVar19;
          bVar44 = true;
        }
        else {
          bVar44 = false;
          puVar42 = &local_78;
        }
      }
      else {
        *local_e0 = uVar31;
        local_118 = (byte *)uVar12;
        local_e0 = puVar19;
        if (uVar26 < uVar31) goto LAB_0014abc7;
        bVar44 = false;
        local_e0 = &local_78;
      }
    }
  } while (bVar44);
  *local_e0 = 0;
  *puVar42 = 0;
  if ((dictMode == ZSTD_dictMatchState) && (uVar27 != 0)) {
    pZVar6 = ms->dictMatchState;
    if ((uint)local_68 < 4) {
      sVar8 = (*(code *)(&DAT_0015ef20 + *(int *)(&DAT_0015ef20 + local_68 * 4)))
                        (&DAT_0015ef20 + *(int *)(&DAT_0015ef20 + local_68 * 4));
      return sVar8;
    }
    UVar38 = pZVar6->hashTable
             [(uint)(*(int *)ip * -0x61c8864f) >> (-(char)(pZVar6->cParams).hashLog & 0x1fU)];
    uVar1 = (ms->window).dictLimit;
    pBVar5 = (pZVar6->window).nextSrc;
    pBVar37 = (pZVar6->window).base;
    uVar36 = (long)pBVar5 - (long)pBVar37;
    uVar20 = (pZVar6->window).lowLimit;
    iVar34 = (int)uVar36;
    uVar31 = (ms->window).lowLimit - iVar34;
    uVar21 = ~(-1 << ((char)(pZVar6->cParams).chainLog - 1U & 0x1f));
    uVar26 = iVar34 - uVar21;
    if (iVar34 - uVar20 <= uVar21) {
      uVar26 = uVar20;
    }
    pUVar43 = pZVar6->chainTable;
    local_130 = 0;
    local_108 = 0;
    do {
      bVar44 = uVar27 == 0;
      uVar27 = uVar27 - 1;
      if ((bVar44) || (UVar38 <= uVar20)) break;
      uVar14 = local_108;
      if (local_130 < local_108) {
        uVar14 = local_130;
      }
      uVar12 = (ulong)UVar38;
      pBVar10 = pBVar37 + uVar12;
      sVar8 = ZSTD_count_2segments(ip + uVar14,pBVar10 + uVar14,iend,pBVar5,pBVar4 + uVar1);
      uVar14 = sVar8 + uVar14;
      pBVar39 = pBVar4 + uVar12 + uVar31;
      if (uVar14 + uVar12 < (uVar36 & 0xffffffff)) {
        pBVar39 = pBVar10;
      }
      if (uVar11 < uVar14) {
        iVar16 = uVar31 + UVar38;
        uVar40 = (uVar25 + 1) - iVar16;
        iVar34 = 0x1f;
        if (uVar40 != 0) {
          for (; uVar40 >> iVar34 == 0; iVar34 = iVar34 + -1) {
          }
        }
        uVar40 = (int)*offsetPtr + 1;
        iVar7 = 0x1f;
        if (uVar40 != 0) {
          for (; uVar40 >> iVar7 == 0; iVar7 = iVar7 + -1) {
          }
        }
        if (iVar34 - iVar7 < ((int)uVar14 - (int)uVar11) * 4) {
          *offsetPtr = (ulong)((uVar25 + 2) - iVar16);
          uVar11 = uVar14;
        }
        if (ip + uVar14 != iend) goto LAB_0014ae37;
        cVar15 = (ip + uVar14 == iend) * '\x03';
      }
      else {
LAB_0014ae37:
        pUVar18 = pUVar43 + (UVar38 & uVar21) * 2;
        if (pBVar39[uVar14] < ip[uVar14]) {
          cVar15 = '\x03';
          if (uVar26 < UVar38) {
            pUVar18 = pUVar18 + 1;
            uVar12 = local_108;
            local_130 = uVar14;
LAB_0014ae8b:
            UVar38 = *pUVar18;
            cVar15 = '\0';
            local_108 = uVar12;
          }
        }
        else {
          cVar15 = '\x03';
          uVar12 = uVar14;
          if (uVar26 < UVar38) goto LAB_0014ae8b;
        }
      }
    } while (cVar15 == '\0');
  }
  ms->nextToUpdate = iVar23 - 8;
  return uVar11;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ms->window.lowLimit;

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}